

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

QString * __thiscall
QSqlRelationalTableModel::selectStatement
          (QString *__return_storage_ptr__,QSqlRelationalTableModel *this)

{
  QArrayDataPointer<char16_t> *this_00;
  QArrayDataPointer<char16_t> *this_01;
  QArrayDataPointer<char16_t> *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  undefined8 uVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  QSqlDriver *pQVar12;
  int *piVar13;
  QSqlRelationalTableModelPrivate *pQVar14;
  pointer pQVar15;
  storage_type *psVar16;
  QArrayDataPointer<char16_t> *__exceptfds;
  fd_set *__writefds;
  int i_1;
  QArrayDataPointer<char16_t> *this_02;
  timeval *in_R8;
  QSqlRelationalTableModelPrivate *pQVar17;
  int i;
  long lVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  long local_230;
  QArrayDataPointer<char16_t> local_200;
  QArrayDataPointer<char16_t> local_1e8;
  QArrayDataPointer<char16_t> local_1c8;
  undefined1 local_1a8 [16];
  undefined1 *puStack_198;
  QArrayDataPointer<char16_t> local_188;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char16_t> local_148;
  QArrayDataPointer<char16_t> local_128;
  QSqlRecord rec;
  QArrayDataPointer<char16_t> local_e8;
  undefined1 local_c8 [32];
  QSqlRelation relation;
  QArrayDataPointer<QString> local_58;
  QHash<QString,_int> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QArrayDataPointer<char16_t> **)(this + 8);
  QSqlTableModel::tableName(&relation.tName,(QSqlTableModel *)this);
  qVar4 = relation.tName.d.size;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&relation);
  if (qVar4 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else if (pQVar1[0x1f].size == 0) {
    QSqlTableModel::selectStatement(__return_storage_ptr__,(QSqlTableModel *)this);
  }
  else {
    local_40.d = (Data *)0x0;
    local_58.size = 0;
    local_58.d = (Data *)0x0;
    local_58.ptr = (QString *)0x0;
    this_00 = pQVar1 + 0x20;
    this_01 = pQVar1 + 0x17;
    __exceptfds = pQVar1;
    for (lVar18 = 0; iVar10 = QSqlRecord::count((QSqlRecord *)this_00), lVar18 < iVar10;
        lVar18 = lVar18 + 1) {
      relation.dColumn.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.dColumn.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.dColumn.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      relation.iColumn.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      relation.iColumn.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.iColumn.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)local_c8,(qsizetype)(pQVar1 + 0x1f));
      if ((totally_ordered_wrapper<QSqlErrorPrivate_*>)local_c8._0_8_ ==
          (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0) {
        relation.dColumn.d.d = (Data *)0x0;
        relation.dColumn.d.ptr = (char16_t *)0x0;
        relation.iColumn.d.ptr = (char16_t *)0x0;
        relation.iColumn.d.size = 0;
        relation.tName.d.size = 0;
        relation.iColumn.d.d = (Data *)0x0;
        relation.tName.d.d = (Data *)0x0;
        relation.tName.d.ptr = (char16_t *)0x0;
        relation.dColumn.d.size = 0;
      }
      else {
        QSqlRelation::QSqlRelation(&relation,*(QSqlRelation **)(pQVar1[0x1f].ptr + lVar18 * 8));
      }
      QSharedPointer<QRelation>::deref((Data *)local_c8._8_8_);
      local_c8._16_8_ = (QArrayDataPointer<char16_t> *)0x0;
      local_c8._0_8_ = (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0;
      local_c8._8_8_ = (Data *)0x0;
      if (((relation.tName.d.size == 0) || (relation.iColumn.d.size == 0)) ||
         (relation.dColumn.d.size == 0)) {
        QSqlRecord::fieldName((QString *)&local_e8,(QSqlRecord *)this_00,(int)lVar18);
        uVar8 = local_c8._16_8_;
        uVar6 = local_c8._8_8_;
        uVar5 = local_c8._0_8_;
        __exceptfds = (QArrayDataPointer<char16_t> *)local_e8.size;
        local_c8._0_8_ = local_e8.d;
        local_c8._8_8_ = local_e8.ptr;
        local_e8.d = (Data *)uVar5;
        local_e8.ptr = (char16_t *)uVar6;
        local_c8._16_8_ = local_e8.size;
        local_e8.size = uVar8;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      }
      else {
        if (relation.dColumn.d.d == (Data *)0x0) {
          local_c8._0_8_ = (QSqlErrorPrivate *)0x0;
        }
        else {
          LOCK();
          ((relation.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((relation.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
          local_c8._0_8_ = relation.dColumn.d.d;
        }
        local_c8._8_8_ = relation.dColumn.d.ptr;
        local_e8.d = (Data *)0x0;
        local_e8.ptr = (char16_t *)0x0;
        local_c8._16_8_ = relation.dColumn.d.size;
        local_e8.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
        __exceptfds = *(QArrayDataPointer<char16_t> **)pQVar12;
        cVar9 = (*(code *)__exceptfds[10].d)(pQVar12,(QArrayDataPointer<char16_t> *)local_c8,0);
        if (cVar9 != '\0') {
          pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
          in_R8 = *(timeval **)pQVar12;
          (*(code *)in_R8[0xf].tv_usec)(&local_e8,pQVar12,(QArrayDataPointer<char16_t> *)local_c8,0)
          ;
          uVar8 = local_c8._16_8_;
          uVar6 = local_c8._8_8_;
          uVar5 = local_c8._0_8_;
          __exceptfds = (QArrayDataPointer<char16_t> *)local_e8.size;
          local_c8._0_8_ = local_e8.d;
          local_c8._8_8_ = local_e8.ptr;
          local_e8.d = (Data *)uVar5;
          local_e8.ptr = (char16_t *)uVar6;
          local_c8._16_8_ = local_e8.size;
          local_e8.size = uVar8;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        }
        rec.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        QSqlTableModel::database((QSqlTableModel *)&local_128);
        local_e8.d = relation.tName.d.d;
        local_e8.ptr = relation.tName.d.ptr;
        local_e8.size = relation.tName.d.size;
        if (relation.tName.d.d != (Data *)0x0) {
          LOCK();
          ((relation.tName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((relation.tName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        QSqlDatabase::record((QSqlDatabase *)&rec,(QString *)&local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        QSqlDatabase::~QSqlDatabase((QSqlDatabase *)&local_128);
        for (iVar10 = 0; iVar11 = QSqlRecord::count(&rec), iVar10 < iVar11; iVar10 = iVar10 + 1) {
          QSqlRecord::fieldName((QString *)&local_e8,&rec,iVar10);
          iVar11 = QString::compare((QString *)local_c8,(CaseSensitivity)&local_e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
          if (iVar11 == 0) {
            QSqlRecord::fieldName((QString *)&local_e8,&rec,iVar10);
            uVar8 = local_c8._16_8_;
            uVar6 = local_c8._8_8_;
            uVar5 = local_c8._0_8_;
            __exceptfds = (QArrayDataPointer<char16_t> *)local_e8.size;
            local_c8._0_8_ = local_e8.d;
            local_c8._8_8_ = local_e8.ptr;
            local_e8.d = (Data *)uVar5;
            local_e8.ptr = (char16_t *)uVar6;
            local_c8._16_8_ = local_e8.size;
            local_e8.size = uVar8;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
            break;
          }
        }
        QSqlRecord::~QSqlRecord(&rec);
      }
      local_e8.d = (Data *)((ulong)local_e8.d & 0xffffffff00000000);
      iVar10 = QHash<QString,_int>::value(&local_40,(QString *)local_c8,(int *)&local_e8);
      piVar13 = QHash<QString,_int>::operator[](&local_40,(QString *)local_c8);
      *piVar13 = iVar10 + 1;
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_58,(QString *)local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      QSqlRelation::~QSqlRelation(&relation);
    }
    local_c8._0_8_ = (totally_ordered_wrapper<QSqlErrorPrivate_*>)0x0;
    local_c8._8_8_ = (Data *)0x0;
    local_c8._16_8_ = (QArrayDataPointer<char16_t> *)0x0;
    local_e8.size = 0;
    local_e8.d = (Data *)0x0;
    local_e8.ptr = (char16_t *)0x0;
    rec.d.d.ptr = (QExplicitlySharedDataPointer<QSqlRecordPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QSqlTableModel::tableName(&relation.tName,(QSqlTableModel *)this);
    QSqlQueryModelSql::from((QString *)&rec,&relation.tName);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&relation);
    local_230 = 0;
    lVar18 = 0;
    pQVar17 = (QSqlRelationalTableModelPrivate *)0x0;
    while( true ) {
      iVar10 = QSqlRecord::count((QSqlRecord *)this_00);
      if ((long)iVar10 <= (long)pQVar17) break;
      relation.dColumn.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.dColumn.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.dColumn.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      relation.iColumn.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      relation.iColumn.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.iColumn.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QList<QSharedPointer<QRelation>_>::value
                ((QList<QSharedPointer<QRelation>_> *)&local_128,(qsizetype)(pQVar1 + 0x1f));
      if (local_128.d == (Data *)0x0) {
        relation.dColumn.d.d = (Data *)0x0;
        relation.dColumn.d.ptr = (char16_t *)0x0;
        relation.iColumn.d.ptr = (char16_t *)0x0;
        relation.iColumn.d.size = 0;
        relation.tName.d.size = 0;
        relation.iColumn.d.d = (Data *)0x0;
        relation.tName.d.d = (Data *)0x0;
        relation.tName.d.ptr = (char16_t *)0x0;
        relation.dColumn.d.size = 0;
      }
      else {
        QSqlRelation::QSqlRelation(&relation,*(QSqlRelation **)((long)pQVar1[0x1f].ptr + lVar18));
      }
      QSharedPointer<QRelation>::deref((Data *)local_128.ptr);
      local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSqlTableModel::tableName((QString *)&local_148,(QSqlTableModel *)this);
      pQVar14 = (QSqlRelationalTableModelPrivate *)QSqlDatabase::driver((QSqlDatabase *)this_01);
      QSqlRecord::fieldName((QString *)&local_188,(QSqlRecord *)this_00,(int)pQVar17);
      (**(code **)(*(long *)&(pQVar14->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate +
                  0xa0))(&local_168,pQVar14,&local_188,0);
      __exceptfds = &local_168;
      QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                ((QString *)&local_128,pQVar14,(QString *)&local_148,(QString *)&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      if (((relation.tName.d.size == 0) || (relation.iColumn.d.size == 0)) ||
         (relation.dColumn.d.size == 0)) {
        QSqlQueryModelSql::comma((QString *)&local_148,(QString *)local_c8,(QString *)&local_128);
        QString::operator=((QString *)local_c8,(QString *)&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      }
      else {
        local_148.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_148.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_148.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar14 = pQVar17;
        QSqlRelationalTableModelSql::relTablePrefix((QString *)&local_148,(int)pQVar17);
        local_168.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_168.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_168.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_188.d = relation.dColumn.d.d;
        local_188.ptr = relation.dColumn.d.ptr;
        local_188.size = relation.dColumn.d.size;
        if (relation.dColumn.d.d != (Data *)0x0) {
          LOCK();
          ((relation.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((relation.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  ((QString *)&local_168,pQVar14,(QString *)&local_148,(QString *)&local_188);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        pQVar15 = QList<QString>::data((QList<QString> *)&local_58);
        iVar10 = QHash<QString,_int>::value
                           (&local_40,(QString *)((long)&(pQVar15->d).d + local_230));
        if (1 < iVar10) {
          local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_188.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          local_1a8._0_8_ = relation.tName.d.d;
          local_1a8._8_8_ = relation.tName.d.ptr;
          puStack_198 = (undefined1 *)relation.tName.d.size;
          if (relation.tName.d.d != (Data *)0x0) {
            LOCK();
            ((relation.tName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((relation.tName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          QString::section((QString *)&local_188,(QString *)local_1a8,(QChar)0x2e,-1,-1,
                           (SectionFlags)0x0);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1a8);
          pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
          cVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,&local_188,1);
          if (cVar9 != '\0') {
            pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
            (**(code **)(*(long *)pQVar12 + 0xf8))
                      ((QArrayDataPointer<char16_t> *)local_1a8,pQVar12,&local_188,1);
            qVar4 = local_188.size;
            pcVar3 = local_188.ptr;
            pDVar2 = local_188.d;
            local_188.d = (Data *)local_1a8._0_8_;
            local_188.ptr = (char16_t *)local_1a8._8_8_;
            local_1a8._0_8_ = pDVar2;
            local_1a8._8_8_ = pcVar3;
            local_188.size = (qsizetype)puStack_198;
            puStack_198 = (undefined1 *)qVar4;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_1a8);
          }
          local_1a8._0_8_ = relation.dColumn.d.d;
          local_1a8._8_8_ = relation.dColumn.d.ptr;
          puStack_198 = (undefined1 *)relation.dColumn.d.size;
          if (relation.dColumn.d.d != (Data *)0x0) {
            LOCK();
            ((relation.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((relation.dColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                 _M_i + 1;
            UNLOCK();
          }
          pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
          cVar9 = (**(code **)(*(long *)pQVar12 + 0xf0))
                            (pQVar12,(QArrayDataPointer<char16_t> *)local_1a8,0);
          if (cVar9 != '\0') {
            pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
            (**(code **)(*(long *)pQVar12 + 0xf8))
                      (&local_1c8,pQVar12,(QArrayDataPointer<char16_t> *)local_1a8,0);
            puVar7 = puStack_198;
            uVar6 = local_1a8._8_8_;
            uVar5 = local_1a8._0_8_;
            local_1a8._0_8_ = local_1c8.d;
            local_1a8._8_8_ = local_1c8.ptr;
            local_1c8.d = (Data *)uVar5;
            local_1c8.ptr = (char16_t *)uVar6;
            puStack_198 = (undefined1 *)local_1c8.size;
            local_1c8.size = (qsizetype)puVar7;
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          }
          local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_1c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          psVar16 = (storage_type *)QByteArrayView::lengthHelperCharArray("%1_%2_%3",9);
          QVar19.m_data = psVar16;
          QVar19.m_size = (qsizetype)&local_1e8;
          QString::fromLatin1(QVar19);
          pQVar15 = QList<QString>::data((QList<QString> *)&local_58);
          iVar10 = QHash<QString,_int>::value
                             (&local_40,(QString *)((long)&(pQVar15->d).d + local_230));
          QString::number((int)&local_200,iVar10);
          QString::arg<QString&,QString&,QString>
                    ((type *)&local_1c8,(QString *)&local_1e8,(QString *)&local_188,
                     (QString *)local_1a8,(QString *)&local_200);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
          (**(code **)(*(long *)pQVar12 + 0x100))(pQVar12,0);
          QString::truncate((longlong)&local_1c8);
          pQVar12 = QSqlDatabase::driver((QSqlDatabase *)this_01);
          in_R8 = *(timeval **)pQVar12;
          (*(code *)in_R8[10].tv_sec)(&local_1e8,pQVar12,&local_1c8,0);
          qVar4 = local_1c8.size;
          pcVar3 = local_1c8.ptr;
          pDVar2 = local_1c8.d;
          local_1c8.d = local_1e8.d;
          local_1c8.ptr = local_1e8.ptr;
          local_1e8.d = pDVar2;
          local_1e8.ptr = pcVar3;
          local_1c8.size = local_1e8.size;
          local_1e8.size = qVar4;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          QSqlQueryModelSql::as((QString *)&local_1e8,(QString *)&local_168,(QString *)&local_1c8);
          QString::operator=((QString *)&local_168,(QString *)&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          pQVar15 = QList<QString>::data((QList<QString> *)&local_58);
          piVar13 = QHash<QString,_int>::operator[]
                              (&local_40,(QString *)((long)&(pQVar15->d).d + local_230));
          *piVar13 = *piVar13 + -1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        }
        QSqlQueryModelSql::comma((QString *)&local_188,(QString *)local_c8,(QString *)&local_168);
        QString::operator=((QString *)local_c8,(QString *)&local_188);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        local_188.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_188.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_188.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = relation.tName.d.d;
        local_1a8._8_8_ = relation.tName.d.ptr;
        puStack_198 = (undefined1 *)relation.tName.d.size;
        if (relation.tName.d.d != (Data *)0x0) {
          LOCK();
          ((relation.tName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((relation.tName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
               + 1;
          UNLOCK();
        }
        pQVar14 = (QSqlRelationalTableModelPrivate *)local_1a8;
        QSqlQueryModelSql::concat((QString *)&local_188,(QString *)local_1a8,(QString *)&local_148);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1a8);
        puStack_198 = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_1c8.d = relation.iColumn.d.d;
        local_1c8.ptr = relation.iColumn.d.ptr;
        local_1c8.size = relation.iColumn.d.size;
        if (relation.iColumn.d.d != (Data *)0x0) {
          LOCK();
          ((relation.iColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((relation.iColumn.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + 1;
          UNLOCK();
        }
        __exceptfds = &local_1c8;
        QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
                  ((QString *)local_1a8,pQVar14,(QString *)&local_148,(QString *)&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        local_1c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        QSqlQueryModelSql::eq((QString *)&local_1c8,(QString *)&local_128,(QString *)local_1a8);
        if (*(int *)&pQVar1[0x20].ptr == 0) {
          this_02 = &local_1e8;
          QSqlQueryModelSql::comma((QString *)this_02,(QString *)&rec,(QString *)&local_188);
          QString::operator=((QString *)&rec,(QString *)this_02);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
          QSqlQueryModelSql::et((QString *)this_02,(QString *)&local_e8,(QString *)&local_1c8);
          QString::operator=((QString *)&local_e8,(QString *)this_02);
        }
        else {
          this_02 = &local_200;
          QSqlQueryModelSql::leftJoin((QString *)this_02,(QString *)&local_188);
          QSqlQueryModelSql::concat((QString *)&local_1e8,(QString *)&rec,(QString *)this_02);
          QString::operator=((QString *)&rec,(QString *)&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
          QSqlQueryModelSql::on((QString *)this_02,(QString *)&local_1c8);
          QSqlQueryModelSql::concat((QString *)&local_1e8,(QString *)&rec,(QString *)this_02);
          QString::operator=((QString *)&rec,(QString *)&local_1e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer(this_02);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QSqlRelation::~QSqlRelation(&relation);
      pQVar17 = (QSqlRelationalTableModelPrivate *)
                &(pQVar17->super_QSqlTableModelPrivate).super_QSqlQueryModelPrivate.field_0x1;
      lVar18 = lVar18 + 0x10;
      local_230 = local_230 + 0x18;
    }
    if ((QArrayDataPointer<char16_t> *)local_c8._16_8_ == (QArrayDataPointer<char16_t> *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      relation.tName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      relation.tName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSqlQueryModelSql::select
                ((int)&local_128,(fd_set *)local_c8,__writefds,(fd_set *)__exceptfds,in_R8);
      QSqlQueryModelSql::concat(&relation.tName,(QString *)&local_128,(QString *)&rec);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      local_128.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_128.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_128.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSqlQueryModelSql::paren((QString *)&local_168,(QString *)&local_e8);
      QSqlTableModel::filter((QString *)local_1a8,(QSqlTableModel *)this);
      QSqlQueryModelSql::paren((QString *)&local_188,(QString *)local_1a8);
      QSqlQueryModelSql::et((QString *)&local_148,(QString *)&local_168,(QString *)&local_188);
      QSqlQueryModelSql::where((QString *)&local_128,(QString *)&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
      QSqlQueryModelSql::concat((QString *)&local_148,&relation.tName,(QString *)&local_128);
      (**(code **)(*(long *)this + 0x1f0))(&local_168,this);
      QSqlQueryModelSql::concat(__return_storage_ptr__,(QString *)&local_148,(QString *)&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_148);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_128);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&relation);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&rec);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
    QHash<QString,_int>::~QHash(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QSqlRelationalTableModel::selectStatement() const
{
    Q_D(const QSqlRelationalTableModel);

    if (tableName().isEmpty())
        return QString();
    if (d->relations.isEmpty())
        return QSqlTableModel::selectStatement();

    // Count how many times each field name occurs in the record
    QHash<QString, int> fieldNames;
    QStringList fieldList;
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        QString name;
        if (relation.isValid()) {
            // Count the display column name, not the original foreign key
            name = relation.displayColumn();
            if (d->db.driver()->isIdentifierEscaped(name, QSqlDriver::FieldName))
                name = d->db.driver()->stripDelimiters(name, QSqlDriver::FieldName);

            const QSqlRecord rec = database().record(relation.tableName());
            for (int i = 0; i < rec.count(); ++i) {
                if (name.compare(rec.fieldName(i), Qt::CaseInsensitive) == 0) {
                    name = rec.fieldName(i);
                    break;
                }
            }
        }
        else {
            name = d->baseRec.fieldName(i);
        }
        fieldNames[name] = fieldNames.value(name, 0) + 1;
        fieldList.append(name);
    }

    QString fList;
    QString conditions;
    QString from = SqlrTm::from(tableName());
    for (int i = 0; i < d->baseRec.count(); ++i) {
        QSqlRelation relation = d->relations.value(i) ? d->relations.at(i)->rel : QSqlRelation();
        const QString tableField = d->fullyQualifiedFieldName(tableName(), d->db.driver()->escapeIdentifier(d->baseRec.fieldName(i), QSqlDriver::FieldName));
        if (relation.isValid()) {
            const QString relTableAlias = SqlrTm::relTablePrefix(i);
            QString displayTableField = d->fullyQualifiedFieldName(relTableAlias, relation.displayColumn());

            // Duplicate field names must be aliased
            if (fieldNames.value(fieldList[i]) > 1) {
                QString relTableName = relation.tableName().section(QChar::fromLatin1('.'), -1, -1);
                if (d->db.driver()->isIdentifierEscaped(relTableName, QSqlDriver::TableName))
                    relTableName = d->db.driver()->stripDelimiters(relTableName, QSqlDriver::TableName);
                QString displayColumn = relation.displayColumn();
                if (d->db.driver()->isIdentifierEscaped(displayColumn, QSqlDriver::FieldName))
                    displayColumn = d->db.driver()->stripDelimiters(displayColumn, QSqlDriver::FieldName);
                QString alias = QString::fromLatin1("%1_%2_%3")
                                      .arg(relTableName, displayColumn, QString::number(fieldNames.value(fieldList[i])));
                alias.truncate(d->db.driver()->maximumIdentifierLength(QSqlDriver::FieldName));
                alias = d->db.driver()->escapeIdentifier(alias, QSqlDriver::FieldName);
                displayTableField = SqlrTm::as(displayTableField, alias);
                --fieldNames[fieldList[i]];
            }

            fList = SqlrTm::comma(fList, displayTableField);

            // Join related table
            const QString tblexpr = SqlrTm::concat(relation.tableName(), relTableAlias);
            const QString relTableField = d->fullyQualifiedFieldName(relTableAlias, relation.indexColumn());
            const QString cond = SqlrTm::eq(tableField, relTableField);
            if (d->joinMode == QSqlRelationalTableModel::InnerJoin) {
                // FIXME: InnerJoin code is known to be broken.
                // Use LeftJoin mode if you want correct behavior.
                from = SqlrTm::comma(from, tblexpr);
                conditions = SqlrTm::et(conditions, cond);
            } else {
                from = SqlrTm::concat(from, SqlrTm::leftJoin(tblexpr));
                from = SqlrTm::concat(from, SqlrTm::on(cond));
            }
        } else {
            fList = SqlrTm::comma(fList, tableField);
        }
    }

    if (fList.isEmpty())
        return QString();

    const QString stmt = SqlrTm::concat(SqlrTm::select(fList), from);
    const QString where = SqlrTm::where(SqlrTm::et(SqlrTm::paren(conditions), SqlrTm::paren(filter())));
    return SqlrTm::concat(SqlrTm::concat(stmt, where), orderByClause());
}